

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall
google::protobuf::DescriptorPool::TryFindSymbolInFallbackDatabase(DescriptorPool *this,string *name)

{
  bool bVar1;
  uint uVar2;
  Tables *this_00;
  string *key;
  FileDescriptor *pFVar3;
  undefined1 local_f0 [8];
  FileDescriptorProto file_proto;
  string *name_local;
  DescriptorPool *this_local;
  
  if (this->fallback_database_ == (DescriptorDatabase *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    file_proto._200_8_ = name;
    bVar1 = IsSubSymbolOfBuiltType(this,name);
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_f0);
      uVar2 = (*this->fallback_database_->_vptr_DescriptorDatabase[3])
                        (this->fallback_database_,file_proto._200_8_,(FileDescriptorProto *)local_f0
                        );
      if ((uVar2 & 1) == 0) {
        this_local._7_1_ = false;
      }
      else {
        this_00 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                            (&this->tables_);
        key = FileDescriptorProto::name_abi_cxx11_((FileDescriptorProto *)local_f0);
        pFVar3 = Tables::FindFile(this_00,key);
        if (pFVar3 == (FileDescriptor *)0x0) {
          pFVar3 = BuildFileFromDatabase(this,(FileDescriptorProto *)local_f0);
          if (pFVar3 == (FileDescriptor *)0x0) {
            this_local._7_1_ = false;
          }
          else {
            this_local._7_1_ = true;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_f0);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool DescriptorPool::TryFindSymbolInFallbackDatabase(const string& name) const {
  if (fallback_database_ == NULL) return false;

  // We skip looking in the fallback database if the name is a sub-symbol of
  // any descriptor that already exists in the descriptor pool (except for
  // package descriptors).  This is valid because all symbols except for
  // packages are defined in a single file, so if the symbol exists then we
  // should already have its definition.
  //
  // The other reason to do this is to support "overriding" type definitions
  // by merging two databases that define the same type.  (Yes, people do
  // this.)  The main difficulty with making this work is that
  // FindFileContainingSymbol() is allowed to return both false positives
  // (e.g., SimpleDescriptorDatabase, UpgradedDescriptorDatabase) and false
  // negatives (e.g. ProtoFileParser, SourceTreeDescriptorDatabase).  When two
  // such databases are merged, looking up a non-existent sub-symbol of a type
  // that already exists in the descriptor pool can result in an attempt to
  // load multiple definitions of the same type.  The check below avoids this.
  if (IsSubSymbolOfBuiltType(name)) return false;

  FileDescriptorProto file_proto;
  if (!fallback_database_->FindFileContainingSymbol(name, &file_proto)) {
    return false;
  }

  if (tables_->FindFile(file_proto.name()) != NULL) {
    // We've already loaded this file, and it apparently doesn't contain the
    // symbol we're looking for.  Some DescriptorDatabases return false
    // positives.
    return false;
  }

  if (BuildFileFromDatabase(file_proto) == NULL) {
    return false;
  }

  return true;
}